

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O1

BOOL __thiscall
Js::RecyclableArgumentsArrayWalker::Get
          (RecyclableArgumentsArrayWalker *this,int i,ResolvedObject *pResolvedObject)

{
  List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  List<Js::IDiagObjectAddress_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_01;
  Type pIVar1;
  StringBuilder<Memory::ArenaAllocator> *stringBuilder;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  Type *ppDVar7;
  Type *ppIVar8;
  undefined4 extraout_var;
  Var pvVar10;
  RecyclableObject *this_02;
  LPCWSTR pWVar11;
  ArenaAllocator *alloc;
  RecyclableArgumentsArrayAddress *this_03;
  RecyclableArrayWalker *this_04;
  Type TVar12;
  Var pvVar9;
  
  if (pResolvedObject == (ResolvedObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xc56,"(pResolvedObject)",
                                "Bad usage of RecyclableArgumentsArrayWalker::Get");
    if (!bVar3) goto LAB_008c6b9c;
    *puVar6 = 0;
  }
  if (i < 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xc58,"(i >= 0)","i >= 0");
    if (!bVar3) goto LAB_008c6b9c;
    *puVar6 = 0;
  }
  bVar3 = VarIs<Js::ArgumentsObject>
                    ((this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.instance);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xc59,"(Js::VarIs<Js::ArgumentsObject>(instance))",
                                "Js::VarIs<Js::ArgumentsObject>(instance)");
    if (!bVar3) goto LAB_008c6b9c;
    *puVar6 = 0;
  }
  this_00 = (this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.pMembersList;
  if (this_00 ==
      (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
       *)0x0) {
    return 0;
  }
  if ((this_00->
      super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>
      ).count <= i) {
    return 0;
  }
  ppDVar7 = JsUtil::
            List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            ::Item(this_00,i);
  if (*ppDVar7 == (Type)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xc5d,"(pMembersList->Item(i) != nullptr)",
                                "pMembersList->Item(i) != nullptr");
    if (!bVar3) goto LAB_008c6b9c;
    *puVar6 = 0;
  }
  pResolvedObject->address = (IDiagObjectAddress *)0x0;
  this_01 = this->pFormalsList;
  if ((this_01 ==
       (List<Js::IDiagObjectAddress_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        *)0x0) ||
     ((this_01->
      super_ReadOnlyList<Js::IDiagObjectAddress_*,_Memory::ArenaAllocator,_DefaultComparer>).count
      <= i)) {
    ppDVar7 = JsUtil::
              List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::Item((this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.pMembersList,i
                    );
    pvVar10 = (*ppDVar7)->aVar;
LAB_008c6828:
    pResolvedObject->obj = pvVar10;
  }
  else {
    ppIVar8 = JsUtil::
              List<Js::IDiagObjectAddress_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::Item(this_01,i);
    pIVar1 = *ppIVar8;
    pResolvedObject->address = pIVar1;
    iVar4 = (*pIVar1->_vptr_IDiagObjectAddress[2])(pIVar1,0);
    pvVar9 = (Var)CONCAT44(extraout_var,iVar4);
    pResolvedObject->obj = pvVar9;
    ppDVar7 = JsUtil::
              List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::Item((this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.pMembersList,i
                    );
    pvVar10 = (*ppDVar7)->aVar;
    if (pvVar9 == (Var)0x0) goto LAB_008c6828;
    if (pvVar9 != pvVar10) {
      pvVar10 = (this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.instance;
      ppDVar7 = JsUtil::
                List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item((this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.pMembersList
                       ,i);
      JavascriptOperators::SetItem
                (pvVar10,(RecyclableObject *)pvVar10,(*ppDVar7)->propId,pResolvedObject->obj,
                 (this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.scriptContext,
                 PropertyOperation_None,0);
    }
  }
  if (pResolvedObject->obj == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xc74,"(pResolvedObject->obj)","pResolvedObject->obj");
    if (!bVar3) goto LAB_008c6b9c;
    *puVar6 = 0;
  }
  pResolvedObject->scriptContext =
       (this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.scriptContext;
  pvVar10 = pResolvedObject->obj;
  if (pvVar10 == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar3) goto LAB_008c6b9c;
    *puVar6 = 0;
  }
  if (((ulong)pvVar10 & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)pvVar10 & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar3) goto LAB_008c6b9c;
    *puVar6 = 0;
  }
  TVar12 = TypeIds_FirstNumberType;
  if ((((ulong)pvVar10 & 0xffff000000000000) != 0x1000000000000) &&
     (TVar12 = TypeIds_Number, (ulong)pvVar10 >> 0x32 == 0)) {
    this_02 = UnsafeVarTo<Js::RecyclableObject>(pvVar10);
    if (this_02 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_008c6b9c;
      *puVar6 = 0;
    }
    TVar12 = ((this_02->type).ptr)->typeId;
    if ((0x57 < (int)TVar12) && (BVar5 = RecyclableObject::IsExternal(this_02), BVar5 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar3) goto LAB_008c6b9c;
      *puVar6 = 0;
    }
  }
  pResolvedObject->typeId = TVar12;
  stringBuilder =
       ((this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.scriptContext)->
       threadContext->debugManager->pCurrentInterpreterLocation->stringBuilder;
  if (stringBuilder == (StringBuilder<Memory::ArenaAllocator> *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xc7a,"(builder)","builder");
    if (!bVar3) {
LAB_008c6b9c:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  stringBuilder->length = 0;
  stringBuilder->count = 0;
  stringBuilder->firstChunk = (Data *)0x0;
  stringBuilder->secondChunk = (Data *)0x0;
  stringBuilder->lastChunk = (Data *)0x0;
  this_04 = (RecyclableArrayWalker *)
            (this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.pMembersList;
  ppDVar7 = JsUtil::
            List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            ::Item((List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                    *)this_04,i);
  pWVar11 = RecyclableArrayWalker::GetIndexName(this_04,(*ppDVar7)->propId,stringBuilder);
  pResolvedObject->name = pWVar11;
  if ((pResolvedObject->typeId != TypeIds_HostDispatch) &&
     (pResolvedObject->address == (IDiagObjectAddress *)0x0)) {
    alloc = GetArenaFromContext((this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.
                                scriptContext);
    this_03 = (RecyclableArgumentsArrayAddress *)new<Memory::ArenaAllocator>(0x18,alloc,0x366bee);
    pvVar10 = (this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.instance;
    ppDVar7 = JsUtil::
              List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::Item((this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.pMembersList,i
                    );
    RecyclableArgumentsArrayAddress::RecyclableArgumentsArrayAddress
              (this_03,pvVar10,(*ppDVar7)->propId);
    pResolvedObject->address = (IDiagObjectAddress *)this_03;
  }
  return 1;
}

Assistant:

BOOL RecyclableArgumentsArrayWalker::Get(int i, ResolvedObject* pResolvedObject)
    {
        AssertMsg(pResolvedObject, "Bad usage of RecyclableArgumentsArrayWalker::Get");

        Assert(i >= 0);
        Assert(Js::VarIs<Js::ArgumentsObject>(instance));

        if (pMembersList && i < pMembersList->Count())
        {
            Assert(pMembersList->Item(i) != nullptr);

            pResolvedObject->address = nullptr;
            if (pFormalsList && i < pFormalsList->Count())
            {
                pResolvedObject->address = pFormalsList->Item(i);
                pResolvedObject->obj = pResolvedObject->address->GetValue(FALSE);
                if (pResolvedObject->obj == nullptr)
                {
                    // Temp workaround till the arguments (In jit code) work is ready.
                    pResolvedObject->obj = pMembersList->Item(i)->aVar;
                }
                else if (pResolvedObject->obj != pMembersList->Item(i)->aVar)
                {
                    // We set the formals value in the object itself, so that expression evaluation can reflect them correctly
                    Js::HeapArgumentsObject* argObj = static_cast<Js::HeapArgumentsObject*>(instance);
                    JavascriptOperators::SetItem(instance, argObj, (uint32)pMembersList->Item(i)->propId, pResolvedObject->obj, scriptContext, PropertyOperation_None);
                }
            }
            else
            {
                pResolvedObject->obj = pMembersList->Item(i)->aVar;
            }
            Assert(pResolvedObject->obj);

            pResolvedObject->scriptContext = scriptContext;
            pResolvedObject->typeId = JavascriptOperators::GetTypeId(pResolvedObject->obj);

            StringBuilder<ArenaAllocator>* builder = GetBuilder();
            Assert(builder);
            builder->Reset();
            pResolvedObject->name = GetIndexName(pMembersList->Item(i)->propId, builder);

            if (pResolvedObject->typeId != TypeIds_HostDispatch && pResolvedObject->address == nullptr)
            {
                pResolvedObject->address = Anew(GetArenaFromContext(scriptContext),
                    RecyclableArgumentsArrayAddress,
                    instance,
                    pMembersList->Item(i)->propId);
            }
            return TRUE;
        }
        return FALSE;
    }